

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

void irr::executeBlit_TextureBlend_16_to_16(SBlitJob *job)

{
  int iVar1;
  long lVar2;
  u16 uVar3;
  long in_RDI;
  float fVar4;
  float fVar5;
  u32 dx;
  f18 src_x;
  u16 *src;
  u32 dy;
  u16 *dst;
  f18 src_y;
  f18 hscale;
  f18 wscale;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  
  fVar4 = floorf(*(float *)(in_RDI + 0x54) * 262144.0 + 0.0);
  fVar5 = floorf(*(float *)(in_RDI + 0x58) * 262144.0 + 0.0);
  local_14 = 0;
  local_20 = *(long *)(in_RDI + 0x30);
  for (local_24 = 0; local_24 < *(uint *)(in_RDI + 0x3c); local_24 = local_24 + 1) {
    lVar2 = *(long *)(in_RDI + 0x28);
    iVar1 = *(int *)(in_RDI + 0x48);
    local_34 = 0;
    for (local_38 = 0; local_38 < *(uint *)(in_RDI + 0x38); local_38 = local_38 + 1) {
      uVar3 = PixelBlend16(*(u16 *)(local_20 + (ulong)local_38 * 2),
                           *(u16 *)(lVar2 + iVar1 * (local_14 >> 0x12) +
                                   (long)(local_34 >> 0x12) * 2));
      *(u16 *)(local_20 + (ulong)local_38 * 2) = uVar3;
      local_34 = (int)fVar4 + local_34;
    }
    local_20 = local_20 + (ulong)*(uint *)(in_RDI + 0x4c);
    local_14 = (int)fVar5 + local_14;
  }
  return;
}

Assistant:

static void executeBlit_TextureBlend_16_to_16(const SBlitJob *job)
{
	const f18 wscale = f32_to_f18(job->x_stretch);
	const f18 hscale = f32_to_f18(job->y_stretch);

	f18 src_y = f18_zero;
	u16 *dst = (u16 *)job->dst;

	for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
		const u16 *src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));
		f18 src_x = f18_zero;
		for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
			dst[dx] = PixelBlend16(dst[dx], src[f18_floor(src_x)]);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}